

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall
Darts::Details::AutoPool<Darts::Details::DawgNode>::append(AutoPool<Darts::Details::DawgNode> *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar3 = this->size_;
  if (sVar3 == this->capacity_) {
    resize_buf(this,sVar3 + 1);
    sVar3 = this->size_;
  }
  this->size_ = sVar3 + 1;
  pcVar2 = (this->buf_).array_;
  pcVar1 = pcVar2 + sVar3 * 0xc + 7;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar2 = pcVar2 + sVar3 * 0xc;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  return;
}

Assistant:

void append() {
    if (size_ == capacity_)
      resize_buf(size_ + 1);
    new(&(*this)[size_++]) T;
  }